

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void __thiscall NukedOPL3::WriteReg(NukedOPL3 *this,int reg,int v)

{
  uint uVar1;
  uint uVar2;
  byte data;
  opl_channel *channel;
  
  uVar2 = (uint)reg >> 4 & 0xf;
  if (uVar2 < 0x10) {
    uVar1 = (uint)reg >> 8;
    data = (byte)v;
    switch(uVar2) {
    case 0:
      uVar2 = reg & 0xf;
      if ((uVar1 & 1) == 0) {
        if (uVar2 == 8) {
          (this->opl3).nts = data >> 6 & 1;
        }
      }
      else if (uVar2 == 5) {
        (this->opl3).newm = data & 1;
      }
      else if (uVar2 == 4) {
        chan_set4op(&this->opl3,data);
        return;
      }
      break;
    case 2:
    case 3:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar2 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar1 & 1) == 0) {
          uVar2 = (int)""[reg & 0x1fU];
        }
        slot_write20((this->opl3).slot + uVar2,data);
        return;
      }
      break;
    case 4:
    case 5:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar2 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar1 & 1) == 0) {
          uVar2 = (int)""[reg & 0x1fU];
        }
        slot_write40((this->opl3).slot + uVar2,data);
        return;
      }
      break;
    case 6:
    case 7:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar2 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar1 & 1) == 0) {
          uVar2 = (int)""[reg & 0x1fU];
        }
        slot_write60((this->opl3).slot + uVar2,data);
        return;
      }
      break;
    case 8:
    case 9:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar2 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar1 & 1) == 0) {
          uVar2 = (int)""[reg & 0x1fU];
        }
        slot_write80((this->opl3).slot + uVar2,data);
        return;
      }
      break;
    case 10:
      if ((reg & 0xfU) < 9) {
        chan_writea0((this->opl3).channel + ((uVar1 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xb:
      if ((char)reg == -0x43 && (reg & 0x100U) == 0) {
        (this->opl3).dam = data >> 7;
        (this->opl3).dvb = data >> 6 & 1;
        chan_updaterhythm(&this->opl3,data);
        return;
      }
      if ((reg & 0xfU) < 9) {
        channel = (this->opl3).channel + ((uVar1 & 1) * 9 + (reg & 0xfU));
        chan_writeb0(channel,data);
        if ((v & 0x20U) == 0) {
          chan_disable(channel);
          return;
        }
        chan_enable(channel);
        return;
      }
      break;
    case 0xc:
      if ((reg & 0xfU) < 9) {
        chan_writec0((this->opl3).channel + ((uVar1 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xe:
    case 0xf:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar2 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar1 & 1) == 0) {
          uVar2 = (int)""[reg & 0x1fU];
        }
        (this->opl3).slot[uVar2].reg_wf = data & 7;
        if (((this->opl3).slot[uVar2].chip)->newm == '\0') {
          (this->opl3).slot[uVar2].reg_wf = data & 3;
        }
      }
    }
  }
  return;
}

Assistant:

void NukedOPL3::WriteReg(int reg, int v) {
	v &= 0xff;
	reg &= 0x1ff;
	Bit8u high = (reg >> 8) & 0x01;
	Bit8u regm = reg & 0xff;
	switch (regm & 0xf0) {
	case 0x00:
		if (high) {
			switch (regm & 0x0f) {
			case 0x04:
				chan_set4op(&opl3, v);
				break;
			case 0x05:
				opl3.newm = v & 0x01;
				break;
			}
		}
		else {
			switch (regm & 0x0f) {
			case 0x08:
				opl3.nts = (v >> 6) & 0x01;
				break;
			}
		}
		break;
	case 0x20:
	case 0x30:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write20(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x40:
	case 0x50:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write40(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x60:
	case 0x70:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write60(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x80:
	case 0x90:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write80(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);;
		}
		break;
	case 0xe0:
	case 0xf0:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_writee0(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0xa0:
		if ((regm & 0x0f) < 9) {
			chan_writea0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	case 0xb0:
		if (regm == 0xbd && !high) {
			opl3.dam = v >> 7;
			opl3.dvb = (v >> 6) & 0x01;
			chan_updaterhythm(&opl3, v);
		}
		else if ((regm & 0x0f) < 9) {
			chan_writeb0(&opl3.channel[9 * high + (regm & 0x0f)], v);
			if (v & 0x20) {
				chan_enable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
			else {
				chan_disable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
		}
		break;
	case 0xc0:
		if ((regm & 0x0f) < 9) {
			chan_writec0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	}
}